

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  ushort *puVar2;
  short *psVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  int iVar24;
  parasail_result_t *ppVar25;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  __m128i *palVar30;
  undefined2 uVar31;
  uint uVar32;
  ulong size;
  long lVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  int32_t segNum;
  long lVar42;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar50;
  short sVar54;
  ulong uVar51;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar52 [16];
  __m128i alVar53;
  short sVar58;
  ushort uVar59;
  undefined4 uVar60;
  ushort uVar72;
  ushort uVar73;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ushort uVar71;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short sVar74;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar89;
  undefined1 auVar82 [16];
  undefined1 auVar90 [16];
  ushort uVar91;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  undefined1 auVar92 [16];
  ushort uVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  int iVar110;
  int iVar112;
  int iVar113;
  int iVar114;
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_a8;
  ushort uStack_a6;
  short local_68;
  short sStack_66;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar43;
  short sVar49;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_1();
        }
        else {
          uVar23 = uVar4 - 1;
          uVar39 = (ulong)uVar4 + 7;
          size = uVar39 >> 3;
          uVar51 = (ulong)uVar23 % size;
          iVar24 = (int)(uVar23 / size);
          iVar34 = -open;
          iVar35 = ppVar6->min;
          iVar41 = -iVar35;
          if (iVar35 != iVar34 && SBORROW4(iVar35,iVar34) == iVar35 + open < 0) {
            iVar41 = open;
          }
          iVar113 = ppVar6->max;
          ppVar25 = parasail_result_new_rowcol1((uint)uVar39 & 0x7ffffff8,s2Len);
          if (ppVar25 != (parasail_result_t *)0x0) {
            ppVar25->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar25->flag | 0x8240402;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar26 = s2Len + -1;
              uVar32 = 7 - iVar24;
              auVar46 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar44 = auVar46._0_4_;
              auVar46 = pshuflw(auVar46,ZEXT416((uint)gap),0);
              uVar45 = auVar46._0_4_;
              uVar27 = iVar41 - 0x7fff;
              auVar46 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
              auVar47._0_4_ = auVar46._0_4_;
              auVar47._4_4_ = auVar47._0_4_;
              auVar47._8_4_ = auVar47._0_4_;
              auVar47._12_4_ = auVar47._0_4_;
              auVar61 = ZEXT416(CONCAT22((short)((uint)iVar35 >> 0x10),0x7ffe - (short)iVar113));
              auVar61 = pshuflw(auVar61,auVar61,0);
              uVar60 = auVar61._0_4_;
              auVar75._4_4_ = uVar60;
              auVar75._0_4_ = uVar60;
              auVar75._8_4_ = uVar60;
              auVar75._12_4_ = uVar60;
              auVar62 = pshuflw(ZEXT416(uVar32),ZEXT416(uVar32),0);
              uVar28 = (uint)size;
              auVar90 = pshufb(ZEXT416(-(uVar28 * gap)),_DAT_00906db0);
              auVar90 = paddsw(auVar90,ZEXT416(uVar27 & 0xffff));
              lVar37 = (long)iVar34;
              uVar40 = 0;
              do {
                lVar42 = 0;
                lVar33 = lVar37;
                do {
                  lVar38 = lVar33;
                  if (s1_beg != 0) {
                    lVar38 = 0;
                  }
                  uVar31 = 0x8000;
                  if (-0x8000 < lVar38) {
                    uVar31 = (undefined2)lVar38;
                  }
                  *(undefined2 *)((long)&local_48 + lVar42 * 2) = uVar31;
                  lVar38 = lVar38 - (ulong)(uint)open;
                  if (lVar38 < -0x7fff) {
                    lVar38 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar42 * 2) = (short)lVar38;
                  lVar42 = lVar42 + 1;
                  lVar33 = lVar33 - size * (uint)gap;
                } while (lVar42 != 8);
                ptr_02[uVar40][0] = local_48;
                ptr_02[uVar40][1] = lStack_40;
                ptr[uVar40][0] = local_58;
                ptr[uVar40][1] = lStack_50;
                uVar40 = uVar40 + 1;
                lVar37 = lVar37 - (ulong)(uint)gap;
              } while (uVar40 != size);
              *ptr_00 = 0;
              auVar68 = _DAT_00906ca0;
              lVar37 = (ulong)(uint)s2Len - 1;
              auVar92._8_4_ = (int)lVar37;
              auVar92._0_8_ = lVar37;
              auVar92._12_4_ = (int)((ulong)lVar37 >> 0x20);
              auVar111._4_4_ = gap;
              auVar111._0_4_ = gap;
              auVar111._8_4_ = gap;
              auVar111._12_4_ = gap;
              iVar35 = -gap;
              auVar92 = auVar92 ^ _DAT_00906ca0;
              auVar75 = pmovsxwd(auVar75,0x8000800080008000);
              iVar41 = 0;
              uVar40 = 0;
              do {
                uVar60 = (undefined4)uVar40;
                auVar115._8_4_ = uVar60;
                auVar115._0_8_ = uVar40;
                auVar115._12_4_ = (int)(uVar40 >> 0x20);
                auVar63 = (auVar115 | _DAT_00903a90) ^ auVar68;
                lVar37 = auVar92._0_8_;
                auVar64._0_8_ = -(ulong)(lVar37 < auVar63._0_8_);
                lVar33 = auVar92._8_8_;
                auVar64._8_8_ = -(ulong)(lVar33 < auVar63._8_8_);
                auVar117 = pshuflw(in_XMM13,auVar64,0xe8);
                auVar63._8_4_ = 0xffffffff;
                auVar63._0_8_ = 0xffffffffffffffff;
                auVar63._12_4_ = 0xffffffff;
                in_XMM13 = packssdw(auVar117 ^ auVar63,auVar117 ^ auVar63);
                iVar113 = gap * 2 + iVar41;
                iVar114 = gap * 3 + iVar41;
                auVar117._4_4_ = open;
                auVar117._0_4_ = iVar41;
                auVar117._12_4_ = iVar114;
                auVar117._8_4_ = iVar113;
                iVar110 = iVar34 - iVar41;
                iVar112 = iVar35 - open;
                iVar113 = iVar34 - iVar113;
                iVar114 = iVar34 - iVar114;
                iVar8 = auVar75._0_4_;
                iVar9 = auVar75._4_4_;
                iVar10 = auVar75._8_4_;
                iVar11 = auVar75._12_4_;
                uVar91 = 0;
                if ((in_XMM13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar110 < iVar8) * auVar75._0_2_ |
                           (ushort)(iVar110 >= iVar8) * (short)iVar110;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 1] = uVar93;
                }
                auVar63 = packssdw(auVar64,auVar64);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar16,auVar63 ^ auVar16);
                if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar112 < iVar9) * auVar75._4_2_ |
                           (ushort)(iVar112 >= iVar9) * (short)iVar112;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 2] = uVar93;
                }
                auVar63 = (auVar115 | _DAT_00903a80) ^ auVar68;
                auVar65._0_8_ = -(ulong)(lVar37 < auVar63._0_8_);
                auVar65._8_8_ = -(ulong)(lVar33 < auVar63._8_8_);
                auVar63 = packssdw(auVar117,auVar65);
                auVar17._8_4_ = 0xffffffff;
                auVar17._0_8_ = 0xffffffffffffffff;
                auVar17._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar17,auVar63 ^ auVar17);
                if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar113 < iVar10) * auVar75._8_2_ |
                           (ushort)(iVar113 >= iVar10) * (short)iVar113;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 3] = uVar93;
                }
                auVar63 = pshufhw(auVar63,auVar65,0x84);
                auVar18._8_4_ = 0xffffffff;
                auVar18._0_8_ = 0xffffffffffffffff;
                auVar18._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar18,auVar63 ^ auVar18);
                if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar114 < iVar11) * auVar75._12_2_ |
                           (ushort)(iVar114 >= iVar11) * (short)iVar114;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 4] = uVar93;
                }
                auVar52._4_4_ = uVar60;
                auVar52._0_4_ = uVar60;
                auVar52._8_4_ = uVar60;
                auVar52._12_4_ = uVar60;
                auVar63 = pmulld(auVar52 | _DAT_00904a90,auVar111);
                iVar113 = iVar34 - auVar63._0_4_;
                iVar114 = iVar34 - auVar63._4_4_;
                iVar110 = iVar34 - auVar63._8_4_;
                iVar112 = iVar34 - auVar63._12_4_;
                auVar117 = (auVar115 | _DAT_00903ad0) ^ auVar68;
                auVar66._0_8_ = -(ulong)(lVar37 < auVar117._0_8_);
                auVar66._8_8_ = -(ulong)(lVar33 < auVar117._8_8_);
                auVar63 = pshuflw(auVar63,auVar66,0xe8);
                auVar19._8_4_ = 0xffffffff;
                auVar19._0_8_ = 0xffffffffffffffff;
                auVar19._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar19,auVar63 ^ auVar19);
                if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar113 < iVar8) * auVar75._0_2_ |
                           (ushort)(iVar113 >= iVar8) * (short)iVar113;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 5] = uVar93;
                }
                auVar117 = packssdw(auVar66,auVar66);
                auVar20._8_4_ = 0xffffffff;
                auVar20._0_8_ = 0xffffffffffffffff;
                auVar20._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63,auVar117 ^ auVar20);
                if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar114 < iVar9) * auVar75._4_2_ |
                           (ushort)(iVar114 >= iVar9) * (short)iVar114;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 6] = uVar93;
                }
                auVar117 = (auVar115 | _DAT_00903ac0) ^ auVar68;
                auVar116._0_8_ = -(ulong)(lVar37 < auVar117._0_8_);
                auVar116._8_8_ = -(ulong)(lVar33 < auVar117._8_8_);
                auVar63 = packssdw(auVar63,auVar116);
                auVar21._8_4_ = 0xffffffff;
                auVar21._0_8_ = 0xffffffffffffffff;
                auVar21._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar21,auVar63 ^ auVar21);
                if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar110 < iVar10) * auVar75._8_2_ |
                           (ushort)(iVar110 >= iVar10) * (short)iVar110;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 7] = uVar93;
                }
                auVar63 = pshufhw(auVar63,auVar116,0x84);
                auVar22._8_4_ = 0xffffffff;
                auVar22._0_8_ = 0xffffffffffffffff;
                auVar22._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar22,auVar63 ^ auVar22);
                if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  uVar93 = (ushort)(iVar112 < iVar11) * auVar75._12_2_ |
                           (ushort)(iVar112 >= iVar11) * (short)iVar112;
                  if (s2_beg != 0) {
                    uVar93 = uVar91;
                  }
                  ptr_00[uVar40 + 8] = uVar93;
                }
                uVar40 = uVar40 + 8;
                iVar35 = iVar35 + gap * -8;
                iVar41 = iVar41 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar40);
              auVar68._4_4_ = uVar44;
              auVar68._0_4_ = uVar44;
              auVar68._8_4_ = uVar44;
              auVar68._12_4_ = uVar44;
              alVar53 = (__m128i)psubsw((undefined1  [16])0x0,auVar68);
              palVar30 = ptr_03 + (uVar28 - 1);
              local_a8 = auVar61._0_2_;
              uStack_a6 = auVar61._2_2_;
              uVar40 = size;
              uVar91 = local_a8;
              uVar93 = uStack_a6;
              uVar94 = local_a8;
              uVar95 = uStack_a6;
              uVar96 = local_a8;
              uVar97 = uStack_a6;
              uVar98 = local_a8;
              uVar99 = uStack_a6;
              do {
                *palVar30 = alVar53;
                auVar61._4_4_ = uVar45;
                auVar61._0_4_ = uVar45;
                auVar61._8_4_ = uVar45;
                auVar61._12_4_ = uVar45;
                alVar53 = (__m128i)psubsw((undefined1  [16])alVar53,auVar61);
                sVar50 = (short)alVar53[0];
                uVar91 = (ushort)(sVar50 < (short)uVar91) * sVar50 |
                         (sVar50 >= (short)uVar91) * uVar91;
                sVar50 = alVar53[0]._2_2_;
                uVar93 = (ushort)(sVar50 < (short)uVar93) * sVar50 |
                         (sVar50 >= (short)uVar93) * uVar93;
                sVar50 = alVar53[0]._4_2_;
                uVar94 = (ushort)(sVar50 < (short)uVar94) * sVar50 |
                         (sVar50 >= (short)uVar94) * uVar94;
                sVar50 = alVar53[0]._6_2_;
                uVar95 = (ushort)(sVar50 < (short)uVar95) * sVar50 |
                         (sVar50 >= (short)uVar95) * uVar95;
                sVar50 = (short)alVar53[1];
                uVar96 = (ushort)(sVar50 < (short)uVar96) * sVar50 |
                         (sVar50 >= (short)uVar96) * uVar96;
                sVar50 = alVar53[1]._2_2_;
                uVar97 = (ushort)(sVar50 < (short)uVar97) * sVar50 |
                         (sVar50 >= (short)uVar97) * uVar97;
                sVar50 = alVar53[1]._4_2_;
                uVar98 = (ushort)(sVar50 < (short)uVar98) * sVar50 |
                         (sVar50 >= (short)uVar98) * uVar98;
                sVar50 = alVar53[1]._6_2_;
                uVar99 = (ushort)(sVar50 < (short)uVar99) * sVar50 |
                         (sVar50 >= (short)uVar99) * uVar99;
                palVar30 = palVar30 + -1;
                iVar35 = (int)uVar40;
                uVar36 = iVar35 - 1;
                uVar40 = (ulong)uVar36;
              } while (uVar36 != 0 && 0 < iVar35);
              lVar37 = size * 0x10;
              local_68 = auVar62._0_2_;
              sStack_66 = auVar62._2_2_;
              auVar118._0_2_ = -(ushort)(local_68 == 7);
              auVar118._2_2_ = -(ushort)(sStack_66 == 6);
              auVar118._4_2_ = -(ushort)(local_68 == 5);
              auVar118._6_2_ = -(ushort)(sStack_66 == 4);
              auVar118._8_2_ = -(ushort)(local_68 == 3);
              auVar118._10_2_ = -(ushort)(sStack_66 == 2);
              auVar118._12_2_ = -(ushort)(local_68 == 1);
              auVar118._14_2_ = -(ushort)(sStack_66 == 0);
              uVar40 = 0;
              auVar62 = auVar47;
              auVar100 = auVar47;
              iVar35 = iVar26;
              do {
                uVar1 = ptr_02[uVar28 - 1][0];
                auVar101._8_8_ = ptr_02[uVar28 - 1][1] << 0x10 | uVar1 >> 0x30;
                auVar101._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_00[uVar40];
                iVar41 = ppVar6->mapper[(byte)s2[uVar40]];
                auVar67 = psubsw(auVar47,(undefined1  [16])*ptr_03);
                lVar33 = 0;
                auVar61 = auVar47;
                do {
                  auVar75 = *(undefined1 (*) [16])((long)*ptr_02 + lVar33);
                  auVar92 = paddsw(auVar101,*(undefined1 (*) [16])
                                             ((long)pvVar5 + lVar33 + (long)iVar41 * size * 0x10));
                  auVar68 = paddsw(auVar67,*(undefined1 (*) [16])((long)*ptr_03 + lVar33));
                  auVar14._4_4_ = uVar45;
                  auVar14._0_4_ = uVar45;
                  auVar14._8_4_ = uVar45;
                  auVar14._12_4_ = uVar45;
                  auVar111 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar33),auVar14);
                  sVar50 = auVar68._0_2_;
                  sVar43 = auVar61._0_2_;
                  auVar76._0_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._2_2_;
                  sVar43 = auVar61._2_2_;
                  auVar76._2_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._4_2_;
                  sVar43 = auVar61._4_2_;
                  auVar76._4_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._6_2_;
                  sVar43 = auVar61._6_2_;
                  auVar76._6_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._8_2_;
                  sVar43 = auVar61._8_2_;
                  auVar76._8_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._10_2_;
                  sVar43 = auVar61._10_2_;
                  auVar76._10_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._12_2_;
                  sVar43 = auVar61._12_2_;
                  sVar49 = auVar61._14_2_;
                  auVar76._12_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar68._14_2_;
                  auVar76._14_2_ =
                       (ushort)(sVar49 < sVar50) * sVar50 | (ushort)(sVar49 >= sVar50) * sVar49;
                  auVar12._4_4_ = uVar44;
                  auVar12._0_4_ = uVar44;
                  auVar12._8_4_ = uVar44;
                  auVar12._12_4_ = uVar44;
                  auVar61 = psubsw(auVar75,auVar12);
                  sVar50 = auVar111._0_2_;
                  sVar43 = auVar61._0_2_;
                  uVar102 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._2_2_;
                  sVar43 = auVar61._2_2_;
                  uVar103 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._4_2_;
                  sVar43 = auVar61._4_2_;
                  uVar104 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._6_2_;
                  sVar43 = auVar61._6_2_;
                  uVar105 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._8_2_;
                  sVar43 = auVar61._8_2_;
                  uVar106 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._10_2_;
                  sVar43 = auVar61._10_2_;
                  uVar107 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._12_2_;
                  sVar43 = auVar61._12_2_;
                  sVar49 = auVar61._14_2_;
                  uVar108 = (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43
                  ;
                  sVar50 = auVar111._14_2_;
                  uVar109 = (ushort)(sVar49 < sVar50) * sVar50 | (ushort)(sVar49 >= sVar50) * sVar49
                  ;
                  sVar50 = auVar92._0_2_;
                  uVar59 = (sVar50 < (short)uVar102) * uVar102 |
                           (ushort)(sVar50 >= (short)uVar102) * sVar50;
                  sVar50 = auVar92._2_2_;
                  uVar71 = (sVar50 < (short)uVar103) * uVar103 |
                           (ushort)(sVar50 >= (short)uVar103) * sVar50;
                  sVar50 = auVar92._4_2_;
                  uVar72 = (sVar50 < (short)uVar104) * uVar104 |
                           (ushort)(sVar50 >= (short)uVar104) * sVar50;
                  sVar50 = auVar92._6_2_;
                  uVar73 = (sVar50 < (short)uVar105) * uVar105 |
                           (ushort)(sVar50 >= (short)uVar105) * sVar50;
                  auVar67._0_8_ = CONCAT26(uVar73,CONCAT24(uVar72,CONCAT22(uVar71,uVar59)));
                  sVar50 = auVar92._8_2_;
                  auVar67._8_2_ =
                       (sVar50 < (short)uVar106) * uVar106 |
                       (ushort)(sVar50 >= (short)uVar106) * sVar50;
                  sVar50 = auVar92._10_2_;
                  auVar67._10_2_ =
                       (sVar50 < (short)uVar107) * uVar107 |
                       (ushort)(sVar50 >= (short)uVar107) * sVar50;
                  sVar50 = auVar92._12_2_;
                  sVar43 = auVar92._14_2_;
                  auVar67._12_2_ =
                       (sVar50 < (short)uVar108) * uVar108 |
                       (ushort)(sVar50 >= (short)uVar108) * sVar50;
                  auVar67._14_2_ =
                       (sVar43 < (short)uVar109) * uVar109 |
                       (ushort)(sVar43 >= (short)uVar109) * sVar43;
                  puVar2 = (ushort *)((long)*ptr + lVar33);
                  *puVar2 = uVar102;
                  puVar2[1] = uVar103;
                  puVar2[2] = uVar104;
                  puVar2[3] = uVar105;
                  puVar2[4] = uVar106;
                  puVar2[5] = uVar107;
                  puVar2[6] = uVar108;
                  puVar2[7] = uVar109;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar33) = auVar67;
                  lVar33 = lVar33 + 0x10;
                  auVar61 = auVar76;
                  auVar101 = auVar75;
                } while (lVar37 != lVar33);
                auVar69._8_8_ = auVar67._8_8_ << 0x10 | (ulong)uVar73;
                uVar1 = uVar40 + 1;
                uVar102 = ptr_00[uVar40 + 1];
                auVar69._0_8_ = auVar67._0_8_ << 0x10 | (ulong)uVar102;
                auVar61 = paddsw((undefined1  [16])*ptr_03,auVar69);
                sVar50 = auVar61._0_2_;
                auVar77._0_2_ =
                     (ushort)((short)auVar76._0_2_ < sVar50) * sVar50 |
                     ((short)auVar76._0_2_ >= sVar50) * auVar76._0_2_;
                sVar50 = auVar61._2_2_;
                auVar77._2_2_ =
                     (ushort)((short)auVar76._2_2_ < sVar50) * sVar50 |
                     ((short)auVar76._2_2_ >= sVar50) * auVar76._2_2_;
                sVar50 = auVar61._4_2_;
                auVar77._4_2_ =
                     (ushort)((short)auVar76._4_2_ < sVar50) * sVar50 |
                     ((short)auVar76._4_2_ >= sVar50) * auVar76._4_2_;
                sVar50 = auVar61._6_2_;
                auVar77._6_2_ =
                     (ushort)((short)auVar76._6_2_ < sVar50) * sVar50 |
                     ((short)auVar76._6_2_ >= sVar50) * auVar76._6_2_;
                sVar50 = auVar61._8_2_;
                auVar77._8_2_ =
                     (ushort)((short)auVar76._8_2_ < sVar50) * sVar50 |
                     ((short)auVar76._8_2_ >= sVar50) * auVar76._8_2_;
                sVar50 = auVar61._10_2_;
                auVar77._10_2_ =
                     (ushort)((short)auVar76._10_2_ < sVar50) * sVar50 |
                     ((short)auVar76._10_2_ >= sVar50) * auVar76._10_2_;
                sVar50 = auVar61._12_2_;
                auVar77._12_2_ =
                     (ushort)((short)auVar76._12_2_ < sVar50) * sVar50 |
                     ((short)auVar76._12_2_ >= sVar50) * auVar76._12_2_;
                sVar50 = auVar61._14_2_;
                auVar77._14_2_ =
                     (ushort)((short)auVar76._14_2_ < sVar50) * sVar50 |
                     ((short)auVar76._14_2_ >= sVar50) * auVar76._14_2_;
                iVar41 = 6;
                do {
                  auVar78._0_8_ = auVar77._0_8_ << 0x10;
                  auVar78._8_8_ = auVar77._8_8_ << 0x10 | auVar77._0_8_ >> 0x30;
                  auVar61 = paddsw(auVar78,auVar90);
                  sVar50 = auVar77._0_2_;
                  sVar55 = auVar61._0_2_;
                  sVar43 = auVar77._2_2_;
                  sVar56 = auVar61._2_2_;
                  sVar49 = auVar77._4_2_;
                  sVar57 = auVar61._4_2_;
                  sVar54 = auVar77._6_2_;
                  sVar58 = auVar61._6_2_;
                  uVar103 = (ushort)(sVar58 < sVar54) * sVar54 | (ushort)(sVar58 >= sVar54) * sVar58
                  ;
                  auVar79._0_8_ =
                       CONCAT26(uVar103,CONCAT24((ushort)(sVar57 < sVar49) * sVar49 |
                                                 (ushort)(sVar57 >= sVar49) * sVar57,
                                                 CONCAT22((ushort)(sVar56 < sVar43) * sVar43 |
                                                          (ushort)(sVar56 >= sVar43) * sVar56,
                                                          (ushort)(sVar55 < sVar50) * sVar50 |
                                                          (ushort)(sVar55 >= sVar50) * sVar55)));
                  sVar50 = auVar77._8_2_;
                  sVar43 = auVar61._8_2_;
                  auVar79._8_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar77._10_2_;
                  sVar43 = auVar61._10_2_;
                  auVar79._10_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar77._12_2_;
                  sVar43 = auVar61._12_2_;
                  sVar49 = auVar61._14_2_;
                  auVar79._12_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar77._14_2_;
                  auVar79._14_2_ =
                       (ushort)(sVar49 < sVar50) * sVar50 | (ushort)(sVar49 >= sVar50) * sVar49;
                  iVar41 = iVar41 + -1;
                  auVar77 = auVar79;
                } while (iVar41 != 0);
                auVar80._0_8_ = auVar79._0_8_ << 0x10;
                auVar80._8_8_ = auVar79._8_8_ << 0x10 | (ulong)uVar103;
                auVar81 = paddsw(auVar80,ZEXT416(uVar27 & 0xffff));
                sVar50 = auVar81._0_2_;
                auVar70._0_2_ =
                     (ushort)((short)uVar102 < sVar50) * sVar50 |
                     ((short)uVar102 >= sVar50) * uVar102;
                sVar50 = auVar81._2_2_;
                auVar70._2_2_ =
                     (ushort)((short)uVar59 < sVar50) * sVar50 | ((short)uVar59 >= sVar50) * uVar59;
                sVar50 = auVar81._4_2_;
                auVar70._4_2_ =
                     (ushort)((short)uVar71 < sVar50) * sVar50 | ((short)uVar71 >= sVar50) * uVar71;
                sVar50 = auVar81._6_2_;
                auVar70._6_2_ =
                     (ushort)((short)uVar72 < sVar50) * sVar50 | ((short)uVar72 >= sVar50) * uVar72;
                sVar50 = auVar81._8_2_;
                auVar70._8_2_ =
                     (ushort)((short)uVar73 < sVar50) * sVar50 | ((short)uVar73 >= sVar50) * uVar73;
                sVar50 = auVar81._10_2_;
                auVar70._10_2_ =
                     (ushort)((short)auVar67._8_2_ < sVar50) * sVar50 |
                     ((short)auVar67._8_2_ >= sVar50) * auVar67._8_2_;
                sVar50 = auVar81._12_2_;
                auVar70._12_2_ =
                     (ushort)((short)auVar67._10_2_ < sVar50) * sVar50 |
                     ((short)auVar67._10_2_ >= sVar50) * auVar67._10_2_;
                sVar50 = auVar81._14_2_;
                auVar70._14_2_ =
                     (ushort)((short)auVar67._12_2_ < sVar50) * sVar50 |
                     ((short)auVar67._12_2_ >= sVar50) * auVar67._12_2_;
                lVar33 = 0;
                auVar61 = auVar100;
                do {
                  auVar15._4_4_ = uVar45;
                  auVar15._0_4_ = uVar45;
                  auVar15._8_4_ = uVar45;
                  auVar15._12_4_ = uVar45;
                  auVar68 = psubsw(auVar81,auVar15);
                  auVar13._4_4_ = uVar44;
                  auVar13._0_4_ = uVar44;
                  auVar13._8_4_ = uVar44;
                  auVar13._12_4_ = uVar44;
                  auVar75 = psubsw(auVar70,auVar13);
                  sVar50 = auVar75._0_2_;
                  sVar43 = auVar68._0_2_;
                  auVar81._0_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._2_2_;
                  sVar43 = auVar68._2_2_;
                  auVar81._2_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._4_2_;
                  sVar43 = auVar68._4_2_;
                  auVar81._4_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._6_2_;
                  sVar43 = auVar68._6_2_;
                  auVar81._6_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._8_2_;
                  sVar43 = auVar68._8_2_;
                  auVar81._8_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._10_2_;
                  sVar43 = auVar68._10_2_;
                  auVar81._10_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._12_2_;
                  sVar43 = auVar68._12_2_;
                  sVar49 = auVar68._14_2_;
                  auVar81._12_2_ =
                       (ushort)(sVar43 < sVar50) * sVar50 | (ushort)(sVar43 >= sVar50) * sVar43;
                  sVar50 = auVar75._14_2_;
                  auVar81._14_2_ =
                       (ushort)(sVar49 < sVar50) * sVar50 | (ushort)(sVar49 >= sVar50) * sVar49;
                  psVar3 = (short *)((long)*ptr_01 + lVar33);
                  sVar50 = *psVar3;
                  sVar43 = psVar3[1];
                  sVar49 = psVar3[2];
                  sVar54 = psVar3[3];
                  sVar55 = psVar3[4];
                  sVar56 = psVar3[5];
                  sVar57 = psVar3[6];
                  sVar58 = psVar3[7];
                  auVar70._0_2_ =
                       (sVar50 < (short)auVar81._0_2_) * auVar81._0_2_ |
                       (ushort)(sVar50 >= (short)auVar81._0_2_) * sVar50;
                  auVar70._2_2_ =
                       (sVar43 < (short)auVar81._2_2_) * auVar81._2_2_ |
                       (ushort)(sVar43 >= (short)auVar81._2_2_) * sVar43;
                  auVar70._4_2_ =
                       (sVar49 < (short)auVar81._4_2_) * auVar81._4_2_ |
                       (ushort)(sVar49 >= (short)auVar81._4_2_) * sVar49;
                  auVar70._6_2_ =
                       (sVar54 < (short)auVar81._6_2_) * auVar81._6_2_ |
                       (ushort)(sVar54 >= (short)auVar81._6_2_) * sVar54;
                  auVar70._8_2_ =
                       (sVar55 < (short)auVar81._8_2_) * auVar81._8_2_ |
                       (ushort)(sVar55 >= (short)auVar81._8_2_) * sVar55;
                  auVar70._10_2_ =
                       (sVar56 < (short)auVar81._10_2_) * auVar81._10_2_ |
                       (ushort)(sVar56 >= (short)auVar81._10_2_) * sVar56;
                  auVar70._12_2_ =
                       (sVar57 < (short)auVar81._12_2_) * auVar81._12_2_ |
                       (ushort)(sVar57 >= (short)auVar81._12_2_) * sVar57;
                  auVar70._14_2_ =
                       (sVar58 < (short)auVar81._14_2_) * auVar81._14_2_ |
                       (ushort)(sVar58 >= (short)auVar81._14_2_) * sVar58;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar33) = auVar70;
                  uVar91 = ((short)auVar81._0_2_ < (short)uVar91) * auVar81._0_2_ |
                           ((short)auVar81._0_2_ >= (short)uVar91) * uVar91;
                  uVar93 = ((short)auVar81._2_2_ < (short)uVar93) * auVar81._2_2_ |
                           ((short)auVar81._2_2_ >= (short)uVar93) * uVar93;
                  uVar94 = ((short)auVar81._4_2_ < (short)uVar94) * auVar81._4_2_ |
                           ((short)auVar81._4_2_ >= (short)uVar94) * uVar94;
                  uVar95 = ((short)auVar81._6_2_ < (short)uVar95) * auVar81._6_2_ |
                           ((short)auVar81._6_2_ >= (short)uVar95) * uVar95;
                  uVar96 = ((short)auVar81._8_2_ < (short)uVar96) * auVar81._8_2_ |
                           ((short)auVar81._8_2_ >= (short)uVar96) * uVar96;
                  uVar97 = ((short)auVar81._10_2_ < (short)uVar97) * auVar81._10_2_ |
                           ((short)auVar81._10_2_ >= (short)uVar97) * uVar97;
                  uVar98 = ((short)auVar81._12_2_ < (short)uVar98) * auVar81._12_2_ |
                           ((short)auVar81._12_2_ >= (short)uVar98) * uVar98;
                  uVar99 = ((short)auVar81._14_2_ < (short)uVar99) * auVar81._14_2_ |
                           ((short)auVar81._14_2_ >= (short)uVar99) * uVar99;
                  uVar91 = ((short)auVar70._0_2_ < (short)uVar91) * auVar70._0_2_ |
                           ((short)auVar70._0_2_ >= (short)uVar91) * uVar91;
                  uVar93 = ((short)auVar70._2_2_ < (short)uVar93) * auVar70._2_2_ |
                           ((short)auVar70._2_2_ >= (short)uVar93) * uVar93;
                  uVar94 = ((short)auVar70._4_2_ < (short)uVar94) * auVar70._4_2_ |
                           ((short)auVar70._4_2_ >= (short)uVar94) * uVar94;
                  uVar95 = ((short)auVar70._6_2_ < (short)uVar95) * auVar70._6_2_ |
                           ((short)auVar70._6_2_ >= (short)uVar95) * uVar95;
                  uVar96 = ((short)auVar70._8_2_ < (short)uVar96) * auVar70._8_2_ |
                           ((short)auVar70._8_2_ >= (short)uVar96) * uVar96;
                  uVar97 = ((short)auVar70._10_2_ < (short)uVar97) * auVar70._10_2_ |
                           ((short)auVar70._10_2_ >= (short)uVar97) * uVar97;
                  uVar98 = ((short)auVar70._12_2_ < (short)uVar98) * auVar70._12_2_ |
                           ((short)auVar70._12_2_ >= (short)uVar98) * uVar98;
                  uVar99 = ((short)auVar70._14_2_ < (short)uVar99) * auVar70._14_2_ |
                           ((short)auVar70._14_2_ >= (short)uVar99) * uVar99;
                  sVar50 = auVar61._0_2_;
                  auVar100._0_2_ =
                       (sVar50 < (short)auVar70._0_2_) * auVar70._0_2_ |
                       (ushort)(sVar50 >= (short)auVar70._0_2_) * sVar50;
                  sVar50 = auVar61._2_2_;
                  auVar100._2_2_ =
                       (sVar50 < (short)auVar70._2_2_) * auVar70._2_2_ |
                       (ushort)(sVar50 >= (short)auVar70._2_2_) * sVar50;
                  sVar50 = auVar61._4_2_;
                  auVar100._4_2_ =
                       (sVar50 < (short)auVar70._4_2_) * auVar70._4_2_ |
                       (ushort)(sVar50 >= (short)auVar70._4_2_) * sVar50;
                  sVar50 = auVar61._6_2_;
                  auVar100._6_2_ =
                       (sVar50 < (short)auVar70._6_2_) * auVar70._6_2_ |
                       (ushort)(sVar50 >= (short)auVar70._6_2_) * sVar50;
                  sVar50 = auVar61._8_2_;
                  auVar100._8_2_ =
                       (sVar50 < (short)auVar70._8_2_) * auVar70._8_2_ |
                       (ushort)(sVar50 >= (short)auVar70._8_2_) * sVar50;
                  sVar50 = auVar61._10_2_;
                  auVar100._10_2_ =
                       (sVar50 < (short)auVar70._10_2_) * auVar70._10_2_ |
                       (ushort)(sVar50 >= (short)auVar70._10_2_) * sVar50;
                  sVar50 = auVar61._12_2_;
                  sVar43 = auVar61._14_2_;
                  auVar100._12_2_ =
                       (sVar50 < (short)auVar70._12_2_) * auVar70._12_2_ |
                       (ushort)(sVar50 >= (short)auVar70._12_2_) * sVar50;
                  auVar100._14_2_ =
                       (sVar43 < (short)auVar70._14_2_) * auVar70._14_2_ |
                       (ushort)(sVar43 >= (short)auVar70._14_2_) * sVar43;
                  lVar33 = lVar33 + 0x10;
                  auVar61 = auVar100;
                } while (lVar37 != lVar33);
                alVar53 = ptr_02[uVar51];
                sVar50 = auVar62._0_2_;
                sVar74 = (short)alVar53[0];
                auVar82._0_2_ = -(ushort)(sVar50 < sVar74);
                sVar43 = auVar62._2_2_;
                sVar83 = alVar53[0]._2_2_;
                auVar82._2_2_ = -(ushort)(sVar43 < sVar83);
                sVar49 = auVar62._4_2_;
                sVar84 = alVar53[0]._4_2_;
                auVar82._4_2_ = -(ushort)(sVar49 < sVar84);
                sVar54 = auVar62._6_2_;
                sVar85 = alVar53[0]._6_2_;
                auVar82._6_2_ = -(ushort)(sVar54 < sVar85);
                sVar55 = auVar62._8_2_;
                sVar86 = (short)alVar53[1];
                auVar82._8_2_ = -(ushort)(sVar55 < sVar86);
                sVar56 = auVar62._10_2_;
                sVar87 = alVar53[1]._2_2_;
                auVar82._10_2_ = -(ushort)(sVar56 < sVar87);
                sVar57 = auVar62._12_2_;
                sVar88 = alVar53[1]._4_2_;
                sVar89 = alVar53[1]._6_2_;
                auVar82._12_2_ = -(ushort)(sVar57 < sVar88);
                sVar58 = auVar62._14_2_;
                auVar82._14_2_ = -(ushort)(sVar58 < sVar89);
                auVar82 = auVar82 & auVar118;
                if ((((((((((((((((auVar82 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar82 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar82 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar82 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar82 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar82 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar82 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar82 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar82 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar82 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar82 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar82 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar82[0xf] < '\0') {
                  iVar35 = (int)uVar40;
                }
                if (iVar24 < 7) {
                  iVar41 = 0;
                  do {
                    lVar33 = alVar53[1];
                    alVar53[1] = alVar53[0];
                    alVar53[0] = alVar53[1] << 0x10;
                    alVar53[1] = lVar33 << 0x10 | alVar53[1] >> 0x30;
                    iVar41 = iVar41 + 1;
                  } while (iVar41 < (int)uVar32);
                }
                auVar62._0_2_ =
                     (ushort)(sVar74 < sVar50) * sVar50 | (ushort)(sVar74 >= sVar50) * sVar74;
                auVar62._2_2_ =
                     (ushort)(sVar83 < sVar43) * sVar43 | (ushort)(sVar83 >= sVar43) * sVar83;
                auVar62._4_2_ =
                     (ushort)(sVar84 < sVar49) * sVar49 | (ushort)(sVar84 >= sVar49) * sVar84;
                auVar62._6_2_ =
                     (ushort)(sVar85 < sVar54) * sVar54 | (ushort)(sVar85 >= sVar54) * sVar85;
                auVar62._8_2_ =
                     (ushort)(sVar86 < sVar55) * sVar55 | (ushort)(sVar86 >= sVar55) * sVar86;
                auVar62._10_2_ =
                     (ushort)(sVar87 < sVar56) * sVar56 | (ushort)(sVar87 >= sVar56) * sVar87;
                auVar62._12_2_ =
                     (ushort)(sVar88 < sVar57) * sVar57 | (ushort)(sVar88 >= sVar57) * sVar88;
                auVar62._14_2_ =
                     (ushort)(sVar89 < sVar58) * sVar58 | (ushort)(sVar89 >= sVar58) * sVar89;
                ((ppVar25->field_4).rowcols)->score_row[uVar40] = (int)(short)(alVar53[1] >> 0x30);
                uVar40 = uVar1;
              } while (uVar1 != (uint)s2Len);
              uVar40 = 0;
              do {
                psVar3 = (short *)((long)*ptr_02 + uVar40 * 4);
                sVar50 = psVar3[1];
                sVar43 = psVar3[2];
                sVar49 = psVar3[3];
                sVar54 = psVar3[4];
                sVar55 = psVar3[5];
                sVar56 = psVar3[6];
                sVar57 = psVar3[7];
                piVar7 = ((ppVar25->field_4).rowcols)->score_col;
                *(int *)((long)piVar7 + uVar40) = (int)*psVar3;
                *(int *)((long)piVar7 + uVar28 * 4 + uVar40) = (int)sVar50;
                *(int *)((long)piVar7 + size * 8 + uVar40) = (int)sVar43;
                *(int *)((long)piVar7 + (ulong)(uVar28 << 2) * 3 + uVar40) = (int)sVar49;
                *(int *)((long)piVar7 + lVar37 + uVar40) = (int)sVar54;
                *(int *)((long)piVar7 + (ulong)(uVar28 << 2) * 5 + uVar40) = (int)sVar55;
                *(int *)((long)piVar7 + size * 0x18 + uVar40) = (int)sVar56;
                *(int *)((long)piVar7 + size * 0x1c + uVar40) = (int)sVar57;
                uVar40 = uVar40 + 4;
              } while (uVar28 * 4 != uVar40);
              if (s2_end != 0) {
                if (iVar24 < 7) {
                  iVar41 = 0;
                  auVar47 = auVar62;
                  do {
                    auVar90._0_8_ = auVar47._0_8_ << 0x10;
                    auVar90._8_8_ = auVar47._8_8_ << 0x10 | auVar47._0_8_ >> 0x30;
                    auVar62._14_2_ = auVar47._12_2_;
                    iVar41 = iVar41 + 1;
                    auVar47 = auVar90;
                  } while (iVar41 < (int)uVar32);
                }
                uVar27 = (uint)auVar62._14_2_;
              }
              sVar50 = (short)uVar27;
              uVar36 = uVar23;
              if ((s1_end != 0) && ((uVar39 & 0x7ffffff8) != 0)) {
                uVar39 = 0;
                do {
                  uVar29 = ((uint)uVar39 & 7) * uVar28 + ((uint)(uVar39 >> 3) & 0x1fffffff);
                  if ((int)uVar29 < (int)uVar4) {
                    auVar62._14_2_ = *(ushort *)((long)*ptr_02 + uVar39 * 2);
                    if ((short)(ushort)uVar27 < (short)auVar62._14_2_) {
                      uVar27 = (uint)auVar62._14_2_;
                      iVar35 = iVar26;
                      uVar36 = uVar29;
                    }
                    else {
                      if ((int)uVar36 <= (int)uVar29) {
                        uVar29 = uVar36;
                      }
                      if (iVar35 != iVar26) {
                        uVar29 = uVar36;
                      }
                      if (auVar62._14_2_ == (ushort)uVar27) {
                        uVar36 = uVar29;
                      }
                    }
                  }
                  sVar50 = (short)uVar27;
                  uVar39 = uVar39 + 1;
                } while ((uVar28 & 0xfffffff) << 3 != (int)uVar39);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar39 = ptr_02[uVar51][1];
                if (iVar24 < 7) {
                  iVar35 = 0;
                  uVar51 = ptr_02[uVar51][0];
                  do {
                    uVar39 = uVar39 << 0x10 | uVar51 >> 0x30;
                    iVar35 = iVar35 + 1;
                    uVar51 = uVar51 << 0x10;
                  } while (iVar35 < (int)uVar32);
                }
                sVar50 = (short)(uVar39 >> 0x30);
                iVar35 = iVar26;
                uVar36 = uVar23;
              }
              sVar43 = auVar46._0_2_;
              auVar48._0_2_ = -(ushort)((short)uVar91 < sVar43);
              sVar49 = auVar46._2_2_;
              auVar48._2_2_ = -(ushort)((short)uVar93 < sVar49);
              auVar48._4_2_ = -(ushort)((short)uVar94 < sVar43);
              auVar48._6_2_ = -(ushort)((short)uVar95 < sVar49);
              auVar48._8_2_ = -(ushort)((short)uVar96 < sVar43);
              auVar48._10_2_ = -(ushort)((short)uVar97 < sVar49);
              auVar48._12_2_ = -(ushort)((short)uVar98 < sVar43);
              auVar48._14_2_ = -(ushort)((short)uVar99 < sVar49);
              auVar46._0_2_ = -(ushort)((short)local_a8 < (short)auVar100._0_2_);
              auVar46._2_2_ = -(ushort)((short)uStack_a6 < (short)auVar100._2_2_);
              auVar46._4_2_ = -(ushort)((short)local_a8 < (short)auVar100._4_2_);
              auVar46._6_2_ = -(ushort)((short)uStack_a6 < (short)auVar100._6_2_);
              auVar46._8_2_ = -(ushort)((short)local_a8 < (short)auVar100._8_2_);
              auVar46._10_2_ = -(ushort)((short)uStack_a6 < (short)auVar100._10_2_);
              auVar46._12_2_ = -(ushort)((short)local_a8 < (short)auVar100._12_2_);
              auVar46._14_2_ = -(ushort)((short)uStack_a6 < (short)auVar100._14_2_);
              auVar46 = auVar46 | auVar48;
              if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar46[0xf] < '\0') {
                *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
                sVar50 = 0;
                iVar35 = 0;
                uVar36 = 0;
              }
              ppVar25->score = (int)sVar50;
              ppVar25->end_query = uVar36;
              ppVar25->end_ref = iVar35;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar25;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}